

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

error assemble_gpr(context *ctx,token *token,opcode *op,int address)

{
  ulong uVar1;
  unique_ptr<char[],_std::default_delete<char[]>_> uVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  byte in_R8B;
  error *tmpres___LINE__;
  token local_58;
  
  uVar2._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 confirm_type((token *)ctx,(token_type)op);
  if (ctx->pc == 0) {
    uVar3 = (ulong)(byte)op->reuse << (in_R8B & 0x3f);
    uVar1 = *(ulong *)CONCAT44(in_register_0000000c,address);
    if ((uVar3 & uVar1) != 0) {
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    *(ulong *)CONCAT44(in_register_0000000c,address) = uVar3 | uVar1;
    context::tokenize(&local_58,(context *)token);
    *(int *)&op[2].value = local_58.column;
    op[1].value = (uint64_t)local_58.data.string._M_str;
    op[1].reuse = local_58.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
    op->value = (uint64_t)local_58.filename;
    op->reuse = local_58.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    uVar2._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         try_reuse(ctx,token,op,address);
  }
  return (error)uVar2._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl;
}

Assistant:

static error assemble_gpr(context& ctx, token& token, opcode& op, int address)
{
    CHECK(confirm_type(token, token_type::regster));

    op.add_bits(static_cast<uint64_t>(token.data.regster) << address);

    token = ctx.tokenize();
    return try_reuse(ctx, token, op, address);
}